

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_prefixes.c
# Opt level: O2

void PrefSEGCS(PDISASM pMyDisasm)

{
  Int32 *pIVar1;
  UIntPtr UVar2;
  int iVar3;
  
  iVar3 = Security(2,pMyDisasm);
  if (iVar3 != 0) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    ResetREX(pMyDisasm);
    (pMyDisasm->Prefix).CSPrefix = '\x01';
    UVar2 = (pMyDisasm->Reserved_).EIP_;
    (pMyDisasm->Reserved_).EIP_ = UVar2 + 1;
    (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
    pIVar1 = &(pMyDisasm->Reserved_).NB_PREFIX;
    *pIVar1 = *pIVar1 + 1;
    (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(UVar2 + 1);
    (*opcode_map1[*(byte *)(UVar2 + 1)])(pMyDisasm);
    return;
  }
  return;
}

Assistant:

void __bea_callspec__ PrefSEGCS(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    if (GV.VEX.state == InUsePrefix) GV.ERROR_OPCODE = UD_;
    ResetREX(pMyDisasm);
    pMyDisasm->Prefix.CSPrefix = InUsePrefix;
    GV.EIP_++;
    pMyDisasm->Prefix.Number++;
    GV.NB_PREFIX++;
    pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
    (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
}